

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool google::protobuf::ExtensionRangeOptions::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  ExtensionRangeOptions *extendee;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *t;
  uint32_t *puVar2;
  ExtensionRangeOptions *this_;
  MessageLite *msg_local;
  
  extendee = default_instance();
  bVar1 = internal::ExtensionSet::IsInitialized((ExtensionSet *)(msg + 1),(MessageLite *)extendee);
  if (bVar1) {
    t = _internal_uninterpreted_option((ExtensionRangeOptions *)msg);
    bVar1 = internal::AllAreInitialized<google::protobuf::UninterpretedOption>(t);
    if (bVar1) {
      puVar2 = internal::HasBits<1>::operator[]((HasBits<1> *)&msg[2]._internal_metadata_,0);
      if (((*puVar2 & 1) == 0) ||
         (bVar1 = FeatureSet::IsInitialized((FeatureSet *)msg[6]._vptr_MessageLite), bVar1)) {
        msg_local._7_1_ = true;
      }
      else {
        msg_local._7_1_ = false;
      }
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool ExtensionRangeOptions::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const ExtensionRangeOptions&>(msg);
  if (!this_._impl_._extensions_.IsInitialized(&default_instance())) {
    return false;
  }
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_uninterpreted_option()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._impl_.features_->IsInitialized()) return false;
  }
  return true;
}